

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_gej(void)

{
  int iVar1;
  secp256k1_fe fe;
  secp256k1_gej b;
  secp256k1_gej a;
  int i;
  secp256k1_fe *in_stack_fffffffffffffec8;
  secp256k1_gej *in_stack_fffffffffffffed0;
  secp256k1_gej *in_stack_ffffffffffffff00;
  secp256k1_gej *in_stack_ffffffffffffff28;
  secp256k1_gej *in_stack_ffffffffffffff30;
  undefined1 local_a0 [156];
  int local_4;
  
  for (local_4 = 0; local_4 < COUNT; local_4 = local_4 + 1) {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x11a322);
    secp256k1_gej_set_infinity((secp256k1_gej *)0x11a32c);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    testutil_random_gej_test(in_stack_ffffffffffffff00);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    memcpy(&stack0xfffffffffffffec8,local_a0,0x98);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    testutil_random_gej_test(in_stack_ffffffffffffff00);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    test_gej_cmov(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  local_4 = 0;
  while( true ) {
    if (COUNT <= local_4) {
      return;
    }
    testutil_random_gej_test(in_stack_ffffffffffffff00);
    testutil_random_gej_test(in_stack_ffffffffffffff00);
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 != 0) break;
    memcpy(&stack0xfffffffffffffec8,local_a0,0x98);
    testutil_random_fe_non_zero_test((secp256k1_fe *)0x11a48d);
    secp256k1_gej_rescale(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
              ,0xfed,"test condition failed: secp256k1_gej_eq_var(&a, &b)");
      abort();
    }
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c",
          0xfe8,"test condition failed: !secp256k1_gej_eq_var(&a, &b)");
  abort();
}

Assistant:

static void run_gej(void) {
    int i;
    secp256k1_gej a, b;

    /* Tests for secp256k1_gej_cmov */
    for (i = 0; i < COUNT; i++) {
        secp256k1_gej_set_infinity(&a);
        secp256k1_gej_set_infinity(&b);
        test_gej_cmov(&a, &b);

        testutil_random_gej_test(&a);
        test_gej_cmov(&a, &b);
        test_gej_cmov(&b, &a);

        b = a;
        test_gej_cmov(&a, &b);

        testutil_random_gej_test(&b);
        test_gej_cmov(&a, &b);
        test_gej_cmov(&b, &a);
    }

    /* Tests for secp256k1_gej_eq_var */
    for (i = 0; i < COUNT; i++) {
        secp256k1_fe fe;
        testutil_random_gej_test(&a);
        testutil_random_gej_test(&b);
        CHECK(!secp256k1_gej_eq_var(&a, &b));

        b = a;
        testutil_random_fe_non_zero_test(&fe);
        secp256k1_gej_rescale(&a, &fe);
        CHECK(secp256k1_gej_eq_var(&a, &b));
    }
}